

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbrNtbdd.c
# Opt level: O1

int Aig_ManSizeOfGlobalBdds(Aig_Man_t *p)

{
  undefined8 uVar1;
  DdNode **nodeArray;
  uint uVar2;
  int iVar3;
  uint *__ptr;
  void *pvVar4;
  uint uVar5;
  uint uVar6;
  Vec_Ptr_t *pVVar7;
  long lVar8;
  
  uVar6 = p->nObjs[3];
  __ptr = (uint *)malloc(0x10);
  uVar5 = 8;
  if (6 < uVar6 - 1) {
    uVar5 = uVar6;
  }
  __ptr[1] = 0;
  *__ptr = uVar5;
  if (uVar5 == 0) {
    pvVar4 = (void *)0x0;
  }
  else {
    pvVar4 = malloc((long)(int)uVar5 << 3);
  }
  *(void **)(__ptr + 2) = pvVar4;
  pVVar7 = p->vCos;
  if (0 < pVVar7->nSize) {
    uVar6 = *__ptr;
    uVar5 = __ptr[1];
    pvVar4 = *(void **)(__ptr + 2);
    lVar8 = 0;
    do {
      uVar1 = *(undefined8 *)((long)pVVar7->pArray[lVar8] + 0x28);
      if (uVar5 + (int)lVar8 == uVar6) {
        if ((int)uVar6 < 0x10) {
          if (pvVar4 == (void *)0x0) {
            pvVar4 = malloc(0x80);
          }
          else {
            pvVar4 = realloc(pvVar4,0x80);
          }
          uVar6 = 0x10;
        }
        else {
          uVar2 = uVar6 * 2;
          if (SBORROW4(uVar6,uVar2) != 0 < (int)uVar6) {
            uVar6 = uVar2;
            if (pvVar4 == (void *)0x0) {
              pvVar4 = malloc((ulong)uVar2 << 3);
            }
            else {
              pvVar4 = realloc(pvVar4,(ulong)uVar2 << 3);
            }
          }
        }
      }
      *(undefined8 *)((long)pvVar4 + lVar8 * 8 + (long)(int)uVar5 * 8) = uVar1;
      lVar8 = lVar8 + 1;
      pVVar7 = p->vCos;
    } while (lVar8 < pVVar7->nSize);
    __ptr[1] = uVar5 + (int)lVar8;
    *__ptr = uVar6;
    *(void **)(__ptr + 2) = pvVar4;
  }
  nodeArray = *(DdNode ***)(__ptr + 2);
  iVar3 = Cudd_SharingSize(nodeArray,__ptr[1]);
  if (nodeArray != (DdNode **)0x0) {
    free(nodeArray);
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  free(__ptr);
  return iVar3;
}

Assistant:

int Aig_ManSizeOfGlobalBdds( Aig_Man_t * p ) 
{
    Vec_Ptr_t * vFuncsGlob;
    Aig_Obj_t * pObj;
    int RetValue, i;
    // complement the global functions
    vFuncsGlob = Vec_PtrAlloc( Aig_ManCoNum(p) );
    Aig_ManForEachCo( p, pObj, i )
        Vec_PtrPush( vFuncsGlob, Aig_ObjGlobalBdd(pObj) );
    RetValue = Cudd_SharingSize( (DdNode **)Vec_PtrArray(vFuncsGlob), Vec_PtrSize(vFuncsGlob) );
    Vec_PtrFree( vFuncsGlob );
    return RetValue;
}